

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_mvo(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src)

{
  ulong uVar1;
  uint offset;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  int mmu_idx;
  int size;
  uint offset_00;
  uintptr_t unaff_retaddr;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  mmu_idx = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      mmu_idx = 0;
      break;
    case 1:
      abort();
    case 2:
      mmu_idx = 1;
      break;
    case 3:
      mmu_idx = 2;
    }
  }
  offset = l >> 4;
  size = offset + 1;
  offset_00 = l & 0xf;
  access_prepare(&local_58,env,src,offset_00 + 1,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
  access_prepare(&local_80,env,dest,size,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
  uVar4 = cpu_ldub_data_ra_s390x(env,offset + dest,unaff_retaddr);
  bVar2 = access_get_byte(env,&local_58,offset_00,unaff_retaddr);
  access_set_byte(env,&local_80,offset,bVar2 << 4 | (byte)uVar4 & 0xf,unaff_retaddr);
  if (0xf < l) {
    do {
      if ((int)offset_00 < 1) {
        bVar3 = 0;
      }
      else {
        bVar3 = access_get_byte(env,&local_58,offset_00 - 1,unaff_retaddr);
      }
      access_set_byte(env,&local_80,size + -2,bVar3 << 4 | bVar2 >> 4,unaff_retaddr);
      size = size + -1;
      offset_00 = offset_00 - 1;
      bVar2 = bVar3;
    } while (1 < size);
  }
  return;
}

Assistant:

void HELPER(mvo)(CPUS390XState *env, uint32_t l, uint64_t dest, uint64_t src)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    /* MVO always processes one more byte than specified - maximum is 16 */
    const int len_dest = (l >> 4) + 1;
    const int len_src = (l & 0xf) + 1;
    uintptr_t ra = GETPC();
    uint8_t byte_dest, byte_src;
    S390Access srca, desta;
    int i, j;

    srca = access_prepare(env, src, len_src, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, len_dest, MMU_DATA_STORE, mmu_idx, ra);

    /* Handle rightmost byte */
    byte_dest = cpu_ldub_data_ra(env, dest + len_dest - 1, ra);
    byte_src = access_get_byte(env, &srca, len_src - 1, ra);
    byte_dest = (byte_dest & 0x0f) | (byte_src << 4);
    access_set_byte(env, &desta, len_dest - 1, byte_dest, ra);

    /* Process remaining bytes from right to left */
    for (i = len_dest - 2, j = len_src - 2; i >= 0; i--, j--) {
        byte_dest = byte_src >> 4;
        if (j >= 0) {
            byte_src = access_get_byte(env, &srca, j, ra);
        } else {
            byte_src = 0;
        }
        byte_dest |= byte_src << 4;
        access_set_byte(env, &desta, i, byte_dest, ra);
    }
}